

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O1

void __thiscall ins_ekf::InsEkf::Predict(InsEkf *this,double dt)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  Index inner_11;
  long lVar7;
  undefined1 *puVar8;
  ActualDstType actualDst_1;
  double *pdVar9;
  char *__function;
  ActualDstType actualDst_2;
  long lVar10;
  ActualDstType actualDst;
  Matrix<double,_15,_15,_0,_15,_15> *dst;
  Index outer;
  assign_op<double,_double> *paVar11;
  DstEvaluatorType *pDVar12;
  double *pdVar13;
  Index inner_4;
  uint uVar14;
  ulong uVar15;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  *src;
  Index outer_12;
  Vector3d *__return_storage_ptr__;
  ActualDstType actualDst_3;
  undefined8 *puVar16;
  double dVar17;
  XprTypeNested pMVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  Matrix4d omega;
  Vector3d w_est;
  Matrix3d R_pert;
  Matrix3d R_ItoB_hat;
  DstEvaluatorType dstEvaluator_9;
  DstEvaluatorType dstEvaluator_12;
  DstEvaluatorType dstEvaluator_7;
  Matrix3d Jr;
  Matrix3d w_ss;
  Matrix3d d_w_skew_d_biasGq;
  Matrix<double,_12,_12,_0,_12,_12> Qd;
  Matrix3d d_w_skew_d_biasGr;
  Matrix<double,_15,_12,_0,_15,_12> Gk;
  Matrix<double,_15,_15,_0,_15,_15> GQG;
  Matrix3d d_w_skew_d_biasGp;
  Matrix<double,_15,_15,_0,_15,_15> Phi_k;
  assign_op<double,_double> local_1bc1;
  Vector3d *local_1bc0;
  assign_op<double,_double> *local_1bb8;
  Matrix<double,_3,_1,_0,_3,_1> *local_1bb0;
  undefined1 local_1ba8 [16];
  undefined1 local_1b98 [8];
  double dStack_1b90;
  Matrix<double,_3,_1,_0,_3,_1> local_1b88;
  double dStack_1b70;
  double local_1b68;
  double dStack_1b60;
  double local_1b58;
  double dStack_1b50;
  double local_1b48;
  double dStack_1b40;
  double local_1b38;
  double dStack_1b30;
  double local_1b28;
  double dStack_1b20;
  double local_1b18;
  double dStack_1b10;
  Vector3d local_1b08;
  undefined1 local_1ae8 [80];
  Matrix3d local_1a98;
  undefined1 local_1a48 [64];
  Matrix<double,_15,_15,_0,_15,_15> *local_1a08;
  undefined1 local_1a00 [32];
  Matrix<double,_15,_15,_0,_15,_15> *local_19e0 [2];
  undefined1 local_19d0 [72];
  Matrix3d local_1988;
  undefined1 local_1940 [24];
  DstXprType *local_1928;
  undefined1 local_18f8 [1160];
  undefined1 local_1470 [24];
  DstXprType *local_1458;
  double adStack_1438 [2];
  undefined1 local_1428 [24];
  RhsNested local_1410;
  scalar_constant_op<double> local_1408;
  scalar_constant_op<double> local_1400;
  scalar_constant_op<double> local_13f8;
  scalar_constant_op<double> local_13e8;
  undefined1 local_12a8 [24];
  assign_op<double,_double> local_1290 [384];
  undefined1 local_1110 [384];
  undefined1 local_f90 [248];
  double adStack_e98 [2];
  undefined1 local_e88 [16];
  undefined1 local_e78 [16];
  scalar_constant_op<double> sStack_e68;
  RhsNested local_e60;
  scalar_constant_op<double> local_e58;
  Vector3d *pVStack_e50;
  scalar_constant_op<double> local_e48;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  *local_e40;
  Vector3d *local_e38;
  scalar_constant_op<double> local_e30;
  Vector3d *local_e28;
  double local_e18;
  double local_e00;
  undefined1 local_780 [72];
  undefined1 local_738 [80];
  undefined1 *puStack_6e8;
  Vector3d *local_6e0;
  double local_6d8;
  Matrix<double,_3,_1,_0,_3,_1> *local_6d0;
  double local_6c8;
  Vector3d *local_6c0;
  Vector3d *local_6b8;
  double local_6b0;
  double local_6a0;
  Matrix3d **local_698;
  Matrix3d *local_690;
  double dStack_688;
  double local_680;
  double local_678;
  double local_668;
  undefined1 local_5b8 [360];
  undefined1 local_450 [24];
  undefined1 local_438 [312];
  undefined1 local_300 [456];
  undefined1 local_138 [264];
  
  local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
         m_storage.m_data.array[0] -
         (this->bias_g_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
  local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
         m_storage.m_data.array[1] -
         (this->bias_g_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1];
  local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = (this->last_measurements_).super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.
         m_storage.m_data.array[2] -
         (this->bias_g_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
  local_1b98 = (undefined1  [8])
               ((this->last_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.
                array[3] -
               (this->bias_a_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0]);
  dStack_1b90 = (this->last_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.
                array[4] -
                (this->bias_a_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[1];
  local_1bb8 = (assign_op<double,_double> *)
               ((this->last_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.
                array[5] -
               (this->bias_a_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2]);
  SkewSymmetric((Matrix3d *)local_e88,&local_1b08);
  SkewSymmetric((Matrix3d *)local_1428,&local_1b08);
  lVar7 = 0x10;
  do {
    dVar32 = *(double *)((long)adStack_1438 + lVar7);
    dVar33 = *(double *)((long)adStack_1438 + lVar7 + 8);
    dVar17 = *(double *)(local_1428 + lVar7);
    *(double *)(local_780 + lVar7 + 0x38) =
         dVar17 * local_e58.m_other +
         dVar33 * (double)local_e78._8_8_ + dVar32 * (double)local_e88._0_8_;
    *(double *)(local_780 + lVar7 + 0x40) =
         dVar17 * (double)pVStack_e50 +
         dVar33 * sStack_e68.m_other + dVar32 * (double)local_e88._8_8_;
    *(double *)(local_738 + lVar7) =
         dVar17 * local_e48.m_other + dVar33 * (double)local_e60.m_matrix +
         dVar32 * (double)local_e78._0_8_;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x58);
  local_1bc0 = &this->imu_offset_;
  puStack_6e8 = local_738;
  local_6d8 = 1.48219693752374e-323;
  dVar32 = (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
  dVar33 = (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
  dVar17 = (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[2];
  auVar24._0_8_ =
       (double)local_1b98 -
       (dVar17 * (double)local_738._48_8_ +
       dVar33 * (double)local_738._24_8_ + dVar32 * (double)local_738._0_8_);
  auVar24._8_8_ =
       dStack_1b90 -
       (dVar17 * (double)local_738._56_8_ +
       dVar33 * (double)local_738._32_8_ + dVar32 * (double)local_738._8_8_);
  local_1bb8 = (assign_op<double,_double> *)
               ((double)local_1bb8 -
               (dVar17 * (double)local_738._64_8_ + dVar33 * (double)local_738._40_8_ +
               dVar32 * (double)local_738._16_8_));
  _local_1b98 = auVar24;
  local_738._72_8_ = local_1bc0;
  local_6e0 = local_1bc0;
  SkewSymmetric(&local_1988,&local_1b08);
  dStack_1b10 = 0.0;
  local_1b38 = 0.0;
  dStack_1b30 = 0.0;
  local_1b48 = 0.0;
  dStack_1b40 = 0.0;
  local_1b58 = 0.0;
  dStack_1b50 = 0.0;
  local_1b68 = 0.0;
  dStack_1b60 = 0.0;
  local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  dStack_1b70 = 0.0;
  local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  lVar7 = 0x10;
  pdVar9 = local_1988.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array + 2;
  do {
    dVar32 = pdVar9[-1];
    *(double *)(local_1b98 + lVar7) = -((plain_array<double,_9,_0,_0> *)(pdVar9 + -2))->array[0];
    *(double *)(local_1b98 + lVar7 + 8) = -dVar32;
    *(double *)
     ((long)local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
            .array + lVar7) = -*pdVar9;
    pdVar9 = pdVar9 + 3;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x70);
  local_738._0_8_ = &dStack_1b70;
  local_1b28 = local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
  dStack_1b20 = local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1];
  local_1b18 = local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
  local_738._8_8_ = (non_const_type)0x1;
  local_738._16_8_ = (Matrix<double,_3,_1,_0,_3,_1> *)0x3;
  local_738._24_8_ = &local_1b88;
  local_738._32_8_ = 1.48219693752374e-323;
  local_738._40_8_ = 0.0;
  local_738._48_8_ = (Matrix<double,_3,_1,_0,_3,_1> *)0x4;
  local_e88._0_8_ = (assign_op<double,_double> *)&local_1b08;
  Eigen::internal::
  check_for_aliasing<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const>>
            ((Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> *)local_738,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_e88);
  if (((non_const_type)local_738._8_8_ == (non_const_type)0x1) &&
     ((Matrix<double,_3,_1,_0,_3,_1> *)local_738._16_8_ == (Matrix<double,_3,_1,_0,_3,_1> *)0x3)) {
    lVar7 = 0;
    pdVar9 = (double *)local_738._0_8_;
    do {
      *pdVar9 = -(((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_e88._0_8_)->
                 m_storage).m_data.array[lVar7];
      lVar7 = lVar7 + 1;
      pdVar9 = pdVar9 + 4;
    } while (lVar7 != 3);
    auVar20._0_8_ =
         local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] *
         local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2] +
         local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] *
         local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1] +
         local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0] *
         local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    auVar20._8_8_ = 0;
    local_1ba8 = sqrtpd(auVar24,auVar20);
    dVar32 = 1.0;
    dVar33 = 0.0;
    if (local_1ba8._0_8_ <= 1e-10) {
      dVar17 = dt * 0.5;
      dVar21 = local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * dVar17 + 1.0;
      dVar22 = local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1] * dVar17 + 0.0;
      dVar23 = local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * dVar17 + 0.0;
      dVar25 = dStack_1b70 * dVar17 + 0.0;
      dVar26 = local_1b68 * dVar17 + 0.0;
      dVar27 = dStack_1b60 * dVar17 + 1.0;
      dVar28 = local_1b58 * dVar17 + 0.0;
      dVar29 = dStack_1b50 * dVar17 + 0.0;
      dVar30 = local_1b48 * dVar17 + 0.0;
      dVar31 = dStack_1b40 * dVar17 + 0.0;
    }
    else {
      local_1a48._32_8_ = local_1ba8._0_8_ * 0.5 * dt;
      dVar32 = cos((double)local_1a48._32_8_);
      local_1bb0 = (Matrix<double,_3,_1,_0,_3,_1> *)(1.0 / (double)local_1ba8._0_8_);
      dVar17 = sin((double)local_1a48._32_8_);
      dVar17 = dVar17 * (double)local_1bb0;
      dVar21 = local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0] * dVar17 + dVar32;
      dVar33 = dVar32 * 0.0;
      dVar22 = local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1] * dVar17 + dVar33;
      dVar23 = local_1b88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * dVar17 + dVar33;
      dVar25 = dStack_1b70 * dVar17 + dVar33;
      dVar26 = local_1b68 * dVar17 + dVar33;
      dVar27 = dStack_1b60 * dVar17 + dVar32;
      dVar28 = local_1b58 * dVar17 + dVar33;
      dVar29 = dStack_1b50 * dVar17 + dVar33;
      dVar30 = local_1b48 * dVar17 + dVar33;
      dVar31 = dStack_1b40 * dVar17 + dVar33;
    }
    dVar2 = (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[0];
    dVar3 = (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[1];
    dVar4 = (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[2];
    dVar5 = (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
            m_storage.m_data.array[3];
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] =
         (local_1b28 * dVar17 + dVar33) * dVar5 + dVar30 * dVar4 + dVar26 * dVar3 + dVar21 * dVar2;
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] =
         (dStack_1b20 * dVar17 + dVar33) * dVar5 + dVar31 * dVar4 + dVar27 * dVar3 + dVar22 * dVar2;
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] =
         dVar5 * (local_1b18 * dVar17 + dVar33) +
         dVar4 * (local_1b38 * dVar17 + dVar32) + dVar3 * dVar28 + dVar2 * dVar23;
    (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] =
         dVar5 * (dVar17 * dStack_1b10 + dVar32) +
         dVar4 * (dStack_1b30 * dVar17 + dVar33) + dVar3 * dVar29 + dVar2 * dVar25;
    __return_storage_ptr__ = (Vector3d *)local_738;
    QuatToRPY(__return_storage_ptr__,&this->orientation_);
    RPYToRotMat(&local_1a98,__return_storage_ptr__);
    local_738._16_8_ = &this->velocity_;
    local_738._48_8_ = &this->gravity_;
    local_738._64_8_ = local_738 + 0x48;
    local_738._72_8_ =
         local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2] * (double)local_1bb8 +
         local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] * dStack_1b90 +
         local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] * (double)local_1b98;
    puStack_6e8 = (undefined1 *)
                  ((double)local_1bb8 *
                   local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data.array[5] +
                  dStack_1b90 *
                  local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[4] +
                  (double)local_1b98 *
                  local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[3]);
    dVar17 = (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
             .m_data.array[0];
    dVar21 = (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
             .m_data.array[1];
    dVar23 = (double)local_738._72_8_ * dt +
             ((this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] - dt * dVar17);
    dVar25 = (double)puStack_6e8 * dt +
             ((this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1] - dt * dVar21);
    (this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = dVar23;
    (this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dVar25;
    dVar32 = (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
             .m_data.array[2];
    dVar22 = ((double)local_1bb8 *
              local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[8] +
             dStack_1b90 *
             local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[7] +
             (double)local_1b98 *
             local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6]) * dt +
             ((this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2] - dVar32 * dt);
    local_690 = (Matrix3d *)
                (local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] * 0.5 * (double)local_1bb8 +
                local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] * 0.5 * dStack_1b90 +
                local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[0] * 0.5 * (double)local_1b98);
    (this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = dVar22;
    local_738._24_8_ = &this->position_;
    local_6e0 = (Vector3d *)0x3fe0000000000000;
    local_698 = &local_690;
    dStack_688 = local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[5] * 0.5 * (double)local_1bb8 +
                 local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[4] * 0.5 * dStack_1b90 +
                 local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[3] * 0.5 * (double)local_1b98;
    local_680 = local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[8] * 0.5 * (double)local_1bb8 +
                local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[7] * 0.5 * dStack_1b90 +
                local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[6] * 0.5 * (double)local_1b98;
    dVar33 = (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1];
    (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)local_690 * dt * dt +
               ((dVar23 * dt +
                (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[0]) - dVar17 * 0.5 * dt * dt);
    (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = dStack_688 * dt * dt + ((dVar25 * dt + dVar33) - dVar21 * 0.5 * dt * dt);
    (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = local_680 * dt * dt +
               ((dVar22 * dt +
                (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2]) - dVar32 * 0.5 * dt * dt);
    local_1ae8._0_8_ = 1.0;
    local_1ae8._8_8_ = 0.0;
    local_1ae8._16_8_ = 0.0;
    local_1ae8._24_8_ = 0.0;
    local_1ae8._32_8_ = 1.0;
    local_1ae8._40_8_ = 0.0;
    local_1ae8._48_8_ = 0.0;
    local_19d0._0_8_ = 1.0;
    local_19d0._8_8_ = 0.0;
    local_19d0._16_8_ = 0.0;
    local_19d0._24_8_ = 0.0;
    local_19d0._32_8_ = 1.0;
    local_19d0._40_8_ = 0.0;
    local_19d0._48_8_ = 0.0;
    dVar32 = (double)local_1ba8._0_8_ * dt;
    local_1ae8._56_8_ = 0.0;
    local_1ae8._64_8_ = 1.0;
    local_19d0._56_8_ = 0.0;
    local_19d0._64_8_ = 1.0;
    local_1a48._32_8_ = dt;
    local_1a48._40_8_ = dt;
    local_738._32_8_ = dt;
    local_738._40_8_ = dt;
    local_738._56_8_ = local_738._16_8_;
    local_6d8 = dt;
    local_6d0 = (Matrix<double,_3,_1,_0,_3,_1> *)local_738._48_8_;
    local_6c8 = dt;
    local_6b8 = (Vector3d *)dt;
    local_678 = dt;
    local_668 = dt;
    if (1e-10 < dVar32) {
      auVar6._8_8_ = local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[1];
      auVar6._0_8_ = local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
      auVar1._8_8_ = local_1ba8._0_8_;
      auVar1._0_8_ = local_1ba8._0_8_;
      local_18f8._0_16_ = divpd(auVar6,auVar1);
      local_18f8._16_8_ =
           local_1b08.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] / (double)local_1ba8._0_8_;
      pMVar18 = (XprTypeNested)cos(dVar32);
      local_1ba8._0_8_ = pMVar18;
      local_1a48._56_8_ = cos(dVar32);
      local_1a48._56_8_ = 1.0 - (double)local_1a48._56_8_;
      local_1bb0 = (Matrix<double,_3,_1,_0,_3,_1> *)sin(dVar32);
      SkewSymmetric((Matrix3d *)local_e88,(Vector3d *)local_18f8);
      local_738._24_8_ = local_1ba8._0_8_;
      local_738._64_8_ = local_1a48._56_8_;
      local_6d0 = (Matrix<double,_3,_1,_0,_3,_1> *)local_1a48._56_8_;
      local_6b0 = 4.94065645841247e-324;
      local_6a0 = (double)local_1bb0;
      local_1410.m_matrix = (non_const_type)local_1ae8;
      local_1428._16_8_ = local_1940;
      local_1ae8._0_8_ =
           (double)local_1bb0 * (double)local_e88._0_8_ +
           (double)local_1a48._56_8_ * (double)local_18f8._0_8_ * (double)local_18f8._0_8_ +
           (double)local_1ba8._0_8_;
      local_1428._0_8_ = (XprTypeNested)local_780;
      local_1428._8_8_ = local_738;
      local_780._0_8_ = local_1410.m_matrix;
      local_738._72_8_ = (Vector3d *)local_18f8;
      local_6e0 = (Vector3d *)local_18f8;
      local_6c0 = (Vector3d *)local_18f8;
      local_6b8 = (Vector3d *)local_18f8;
      local_690 = (Matrix3d *)local_e88;
      Eigen::internal::
      copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_9>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_1428);
      dVar33 = sin(dVar32);
      local_1ba8._0_8_ = dVar33 / dVar32;
      dVar33 = sin(dVar32);
      local_1bb0 = (Matrix<double,_3,_1,_0,_3,_1> *)(1.0 - dVar33 / dVar32);
      dVar33 = cos(dVar32);
      dVar32 = (1.0 - dVar33) / dVar32;
      SkewSymmetric((Matrix3d *)local_e88,(Vector3d *)local_18f8);
      local_738._24_8_ = local_1ba8._0_8_;
      local_738._64_8_ = local_1bb0;
      local_6d0 = local_1bb0;
      local_6b0 = 4.94065645841247e-324;
      local_690 = (Matrix3d *)local_e88;
      local_1410.m_matrix = (non_const_type)local_19d0;
      local_1428._16_8_ = local_1940;
      local_19d0._0_8_ =
           ((double)local_1bb0 * (double)local_18f8._0_8_ * (double)local_18f8._0_8_ +
           (double)local_1ba8._0_8_) - dVar32 * (double)local_e88._0_8_;
      local_1428._0_8_ = (XprTypeNested)local_780;
      local_1428._8_8_ = local_738;
      local_780._0_8_ = local_1410.m_matrix;
      local_738._72_8_ = (Vector3d *)local_18f8;
      local_6e0 = (Vector3d *)local_18f8;
      local_6c0 = (Vector3d *)local_18f8;
      local_6b8 = (Vector3d *)local_18f8;
      local_6a0 = dVar32;
      Eigen::internal::
      copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_9>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_1428);
    }
    lVar7 = 0;
    memset(__return_storage_ptr__,0,0x708);
    uVar14 = (uint)((ulong)__return_storage_ptr__ >> 3);
    do {
      uVar15 = (ulong)(uVar14 & 1);
      if (uVar15 != 0) {
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[0] = *(double *)(local_1ae8 + lVar7);
      }
      memcpy((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
             m_storage.m_data.array + uVar15,local_1ae8 + lVar7 + uVar15 * 8,
             ((~uVar15 + (uVar15 | 2)) * 8 & 0x7ffffffffffffff0) + 0x10);
      if (uVar15 == 0) {
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[2] = *(double *)(local_1ae8 + lVar7 + 0x10);
      }
      uVar14 = ~(uVar14 & 1);
      lVar7 = lVar7 + 0x18;
      __return_storage_ptr__ = __return_storage_ptr__ + 5;
    } while (lVar7 != 0x48);
    local_1b98 = (undefined1  [8])((double)local_1b98 * (double)local_1a48._32_8_);
    dStack_1b90 = dStack_1b90 * (double)local_1a48._40_8_;
    local_18f8._8_8_ = (double)local_1a48._40_8_ * dStack_1b90;
    local_18f8._0_8_ = (double)local_1a48._32_8_ * (double)local_1b98;
    local_1bb8 = (assign_op<double,_double> *)((double)local_1bb8 * dt);
    local_18f8._16_8_ = (double)local_1bb8 * dt;
    SkewSymmetric((Matrix3d *)local_1428,(Vector3d *)local_18f8);
    lVar7 = 0x10;
    do {
      dVar33 = *(double *)((long)adStack_1438 + lVar7);
      dVar17 = *(double *)((long)adStack_1438 + lVar7 + 8);
      dVar32 = *(double *)(local_1428 + lVar7);
      *(double *)((long)adStack_e98 + lVar7) =
           (local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
            .array[1] * -0.5 * dVar17 +
           local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] * -0.5 * dVar33) -
           local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] * 0.5 * dVar32;
      *(double *)((long)adStack_e98 + lVar7 + 8) =
           (local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
            .array[4] * -0.5 * dVar17 +
           local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] * -0.5 * dVar33) -
           local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] * 0.5 * dVar32;
      *(double *)(local_e88 + lVar7) =
           (dVar17 * local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[7] * -0.5 +
           dVar33 * local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[6] * -0.5) -
           dVar32 * local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[8] * 0.5;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x58);
    puVar16 = (undefined8 *)(local_738 + 0x18);
    uVar14 = 0;
    lVar7 = 0;
    do {
      uVar15 = (ulong)(uVar14 & 1);
      if (uVar15 != 0) {
        *puVar16 = *(undefined8 *)(local_e88 + lVar7);
      }
      memcpy(puVar16 + uVar15,local_e88 + lVar7 + uVar15 * 8,
             ((~uVar15 + (uVar15 | 2)) * 8 & 0x7ffffffffffffff0) + 0x10);
      if (uVar15 == 0) {
        puVar16[2] = *(undefined8 *)(local_e78 + lVar7);
      }
      uVar14 = ~(uVar14 & 1);
      lVar7 = lVar7 + 0x18;
      puVar16 = puVar16 + 0xf;
    } while (lVar7 != 0x48);
    local_18f8._0_16_ = _local_1b98;
    local_18f8._16_8_ = local_1bb8;
    SkewSymmetric((Matrix3d *)local_1428,(Vector3d *)local_18f8);
    lVar7 = 0x10;
    do {
      dVar33 = *(double *)((long)adStack_1438 + lVar7);
      dVar17 = *(double *)((long)adStack_1438 + lVar7 + 8);
      dVar32 = *(double *)(local_1428 + lVar7);
      *(double *)((long)adStack_e98 + lVar7) =
           (dVar17 * -local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1] +
           dVar33 * -local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0]) -
           local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] * dVar32;
      *(double *)((long)adStack_e98 + lVar7 + 8) =
           (dVar17 * -local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[4] +
           dVar33 * -local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[3]) -
           local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] * dVar32;
      *(double *)(local_e88 + lVar7) =
           (dVar17 * -local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[7] +
           dVar33 * -local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[6]) -
           dVar32 * local_1a98.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[8];
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x58);
    puVar16 = (undefined8 *)(local_738 + 0x30);
    uVar14 = (uint)((ulong)puVar16 >> 3);
    lVar7 = 0;
    do {
      uVar15 = (ulong)(uVar14 & 1);
      if (uVar15 != 0) {
        *puVar16 = *(undefined8 *)(local_e88 + lVar7);
      }
      memcpy(puVar16 + uVar15,local_e88 + lVar7 + uVar15 * 8,
             ((~uVar15 + (uVar15 | 2)) * 8 & 0x7ffffffffffffff0) + 0x10);
      if (uVar15 == 0) {
        puVar16[2] = *(undefined8 *)(local_e78 + lVar7);
      }
      uVar14 = ~(uVar14 & 1);
      lVar7 = lVar7 + 0x18;
      puVar16 = puVar16 + 0xf;
    } while (lVar7 != 0x48);
    puVar8 = local_5b8;
    lVar7 = 0;
    do {
      lVar10 = 0;
      do {
        uVar19 = 0x3ff0000000000000;
        if (lVar7 != lVar10) {
          uVar19 = 0;
        }
        *(undefined8 *)(puVar8 + lVar10 * 8) = uVar19;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar7 = lVar7 + 1;
      puVar8 = puVar8 + 0x78;
    } while (lVar7 != 3);
    puVar8 = local_450;
    lVar7 = 0;
    do {
      lVar10 = 0;
      do {
        dVar32 = 1.0;
        if (lVar7 != lVar10) {
          dVar32 = 0.0;
        }
        *(double *)(puVar8 + lVar10 * 8) = dVar32 * dt;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar7 = lVar7 + 1;
      puVar8 = puVar8 + 0x78;
    } while (lVar7 != 3);
    puVar8 = local_438;
    lVar7 = 0;
    do {
      lVar10 = 0;
      do {
        uVar19 = 0x3ff0000000000000;
        if (lVar7 != lVar10) {
          uVar19 = 0;
        }
        *(undefined8 *)(puVar8 + lVar10 * 8) = uVar19;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar7 = lVar7 + 1;
      puVar8 = puVar8 + 0x78;
    } while (lVar7 != 3);
    local_1428._0_8_ = (XprTypeNested)local_300;
    local_1428._8_8_ = (double *)0x3;
    local_1428._16_8_ = (assign_op<double,_double> *)0x3;
    local_1410.m_matrix = (non_const_type)local_738;
    local_1408.m_other = 0.0;
    local_1400.m_other = 4.44659081257122e-323;
    local_13f8.m_other = 7.4109846876187e-323;
    local_e88._8_8_ = (SrcEvaluatorType *)local_e78;
    lVar7 = 0x20;
    do {
      dVar32 = *(double *)(local_1a00 + lVar7 + 0x10);
      dVar33 = *(double *)(local_1a00 + lVar7 + 0x18);
      dVar17 = *(double *)((long)local_19e0 + lVar7);
      *(double *)((long)adStack_e98 + lVar7) =
           dVar17 * -(double)local_1ae8._48_8_ +
           dVar33 * -(double)local_1ae8._24_8_ + dVar32 * -(double)local_1ae8._0_8_;
      *(double *)((long)adStack_e98 + lVar7 + 8) =
           dVar17 * -(double)local_1ae8._56_8_ +
           dVar33 * -(double)local_1ae8._32_8_ + dVar32 * -(double)local_1ae8._8_8_;
      *(double *)(local_e88 + lVar7) =
           (dVar17 * -(double)local_1ae8._64_8_ - dVar33 * (double)local_1ae8._40_8_) -
           dVar32 * (double)local_1ae8._16_8_;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x68);
    local_18f8._16_8_ = local_1940;
    local_18f8._24_8_ = local_1428;
    local_e30.m_other = dt;
    local_780._0_8_ = (XprTypeNested)local_300;
    local_18f8._0_8_ =
         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
          *)local_780;
    local_18f8._8_8_ = (SrcEvaluatorType *)local_e88;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_18f8);
    local_e88._0_8_ = (assign_op<double,_double> *)0xbff0000000000000;
    local_e88._8_8_ =
         (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
          *)0x0;
    local_e78._0_8_ = (assign_op<double,_double> *)0x0;
    SkewSymmetric((Matrix3d *)local_780,(Vector3d *)local_e88);
    sStack_e68.m_other = -0.5;
    pVStack_e50 = (Vector3d *)&local_1988;
    local_e28 = local_1bc0;
    local_18f8._8_8_ = 3;
    local_18f8._0_8_ = local_300 + 0x18;
    local_18f8._16_8_ = (assign_op<double,_double> *)0x1;
    local_18f8._24_8_ = local_738;
    local_18f8._32_8_ = 1.48219693752374e-323;
    local_18f8._40_8_ = 9;
    local_18f8._48_8_ = 7.4109846876187e-323;
    local_1428._16_8_ = (assign_op<double,_double> *)&local_1410;
    local_e60.m_matrix = &local_1a98;
    local_e48.m_other = (double)local_780;
    local_e40 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                 *)local_780;
    local_e38 = pVStack_e50;
    local_e18 = dt;
    local_e00 = dt;
    Eigen::internal::
    generic_product_impl<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,Eigen::DenseShape,Eigen::DenseShape,3>
    ::evalTo<Eigen::Matrix<double,3,1,0,3,1>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&local_1410,
               (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                *)local_e78,local_1bc0);
    local_13f8.m_other = local_e18;
    local_13e8.m_other = local_e00;
    if (((SrcEvaluatorType *)local_18f8._8_8_ == (SrcEvaluatorType *)0x3) &&
       ((assign_op<double,_double> *)local_18f8._16_8_ == (assign_op<double,_double> *)0x1)) {
      local_1470._0_8_ = local_18f8._0_8_;
      local_1940._8_8_ = local_1428;
      local_1940._16_8_ = local_1a00;
      local_1928 = (DstXprType *)local_18f8;
      local_1940._0_8_ = local_1470;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_1940);
      local_18f8._8_8_ = 3;
      local_18f8._0_8_ = local_300 + 0x30;
      local_18f8._16_8_ = (assign_op<double,_double> *)0x1;
      local_18f8._24_8_ = local_738;
      local_18f8._32_8_ = 2.96439387504748e-323;
      local_18f8._40_8_ = 9;
      local_18f8._48_8_ = 7.4109846876187e-323;
      pdVar9 = (double *)(local_1428 + 0x10);
      local_e88._0_8_ = &local_1a98;
      local_e78._0_8_ = &local_1988;
      pVStack_e50 = local_1bc0;
      local_1428._8_8_ = pdVar9;
      local_e78._8_8_ =
           (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
            *)local_780;
      sStack_e68.m_other = (double)local_780;
      local_e60.m_matrix = (non_const_type)local_e78._0_8_;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,1>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)pdVar9,
                 (Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>
                  *)local_e88,(assign_op<double,_double> *)local_1940);
      local_1400.m_other = dt;
      if (((SrcEvaluatorType *)local_18f8._8_8_ == (SrcEvaluatorType *)0x3) &&
         ((assign_op<double,_double> *)local_18f8._16_8_ == (assign_op<double,_double> *)0x1)) {
        local_1940._0_8_ = local_18f8._0_8_;
        local_e88._8_8_ = local_1428;
        local_e78._8_8_ = local_18f8;
        local_e88._0_8_ =
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)local_1940;
        local_e78._0_8_ = local_1470;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_e88);
        local_e88._0_8_ = (assign_op<double,_double> *)0x0;
        local_e88._8_8_ =
             (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
              *)0xbff0000000000000;
        local_e78._0_8_ = (assign_op<double,_double> *)0x0;
        SkewSymmetric((Matrix3d *)local_1940,(Vector3d *)local_e88);
        sStack_e68.m_other = -0.5;
        local_e60.m_matrix = &local_1a98;
        pVStack_e50 = (Vector3d *)&local_1988;
        local_e28 = local_1bc0;
        local_18f8._8_8_ = 3;
        local_18f8._0_8_ = local_300 + 0x90;
        local_18f8._16_8_ = (assign_op<double,_double> *)0x1;
        local_18f8._24_8_ = local_738;
        local_18f8._32_8_ = 1.48219693752374e-323;
        local_18f8._40_8_ = 10;
        local_18f8._48_8_ = 7.4109846876187e-323;
        local_1428._16_8_ = (assign_op<double,_double> *)&local_1410;
        local_e48.m_other = (double)local_1940;
        local_e40 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                     *)local_1940;
        local_e38 = pVStack_e50;
        local_e18 = dt;
        local_e00 = dt;
        Eigen::internal::
        generic_product_impl<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,Eigen::DenseShape,Eigen::DenseShape,3>
        ::evalTo<Eigen::Matrix<double,3,1,0,3,1>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)&local_1410,
                   (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                    *)local_e78,local_1bc0);
        local_13f8.m_other = local_e18;
        local_13e8.m_other = local_e00;
        if (((SrcEvaluatorType *)local_18f8._8_8_ == (SrcEvaluatorType *)0x3) &&
           ((assign_op<double,_double> *)local_18f8._16_8_ == (assign_op<double,_double> *)0x1)) {
          local_1a00._0_8_ = local_18f8._0_8_;
          local_1470._0_8_ = local_1a00;
          local_1470._8_8_ = local_1428;
          local_1470._16_8_ = local_1a48;
          local_1458 = (DstXprType *)local_18f8;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)local_1470);
          local_18f8._8_8_ = 3;
          local_18f8._0_8_ = local_300 + 0xa8;
          local_18f8._16_8_ = (assign_op<double,_double> *)0x1;
          local_18f8._24_8_ = local_738;
          local_18f8._32_8_ = 2.96439387504748e-323;
          local_18f8._40_8_ = 10;
          local_18f8._48_8_ = 7.4109846876187e-323;
          local_e88._0_8_ = &local_1a98;
          local_e78._0_8_ = &local_1988;
          pVStack_e50 = local_1bc0;
          local_1428._8_8_ = pdVar9;
          local_e78._8_8_ =
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)local_1940;
          sStack_e68.m_other = (double)local_1940;
          local_e60.m_matrix = (non_const_type)local_e78._0_8_;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,1>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,_3,_1,_0,_3,_1> *)pdVar9,
                     (Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>
                      *)local_e88,(assign_op<double,_double> *)local_1470);
          local_1400.m_other = dt;
          if (((SrcEvaluatorType *)local_18f8._8_8_ == (SrcEvaluatorType *)0x3) &&
             ((assign_op<double,_double> *)local_18f8._16_8_ == (assign_op<double,_double> *)0x1)) {
            local_1470._0_8_ = local_18f8._0_8_;
            local_e88._8_8_ = local_1428;
            local_e78._0_8_ = local_1a00;
            local_e78._8_8_ = local_18f8;
            local_e88._0_8_ =
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                  *)local_1470;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)local_e88);
            local_e88._0_8_ = (assign_op<double,_double> *)0x0;
            local_e88._8_8_ =
                 (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                  *)0x0;
            local_e78._0_8_ = (assign_op<double,_double> *)0xbff0000000000000;
            SkewSymmetric((Matrix3d *)local_1470,(Vector3d *)local_e88);
            sStack_e68.m_other = -0.5;
            local_e60.m_matrix = &local_1a98;
            pVStack_e50 = (Vector3d *)&local_1988;
            local_e28 = local_1bc0;
            local_18f8._8_8_ = 3;
            local_18f8._0_8_ = local_300 + 0x108;
            local_18f8._16_8_ = (assign_op<double,_double> *)0x1;
            local_18f8._24_8_ = local_738;
            local_18f8._32_8_ = 1.48219693752374e-323;
            local_18f8._40_8_ = 0xb;
            local_18f8._48_8_ = 7.4109846876187e-323;
            local_1428._16_8_ = (assign_op<double,_double> *)&local_1410;
            local_e48.m_other = (double)local_1470;
            local_e40 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                         *)local_1470;
            local_e38 = pVStack_e50;
            local_e18 = dt;
            local_e00 = dt;
            Eigen::internal::
            generic_product_impl<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,Eigen::DenseShape,Eigen::DenseShape,3>
            ::evalTo<Eigen::Matrix<double,3,1,0,3,1>>
                      ((Matrix<double,_3,_1,_0,_3,_1> *)&local_1410,
                       (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                        *)local_e78,local_1bc0);
            local_13f8.m_other = local_e18;
            local_13e8.m_other = local_e00;
            if (((SrcEvaluatorType *)local_18f8._8_8_ == (SrcEvaluatorType *)0x3) &&
               ((assign_op<double,_double> *)local_18f8._16_8_ == (assign_op<double,_double> *)0x1))
            {
              local_1a48._0_8_ = local_18f8._0_8_;
              local_1a00._0_8_ = local_1a48;
              local_1a00._8_8_ = local_1428;
              local_1a00._24_8_ = local_18f8;
              local_1a00._16_8_ = (assign_op<double,_double> *)&local_1a08;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)local_1a00);
              local_18f8._8_8_ = 3;
              local_18f8._0_8_ = local_300 + 0x120;
              local_18f8._16_8_ = (assign_op<double,_double> *)0x1;
              local_18f8._24_8_ = local_738;
              local_18f8._32_8_ = 2.96439387504748e-323;
              local_18f8._40_8_ = 0xb;
              local_18f8._48_8_ = 7.4109846876187e-323;
              local_e88._0_8_ = &local_1a98;
              local_e78._0_8_ = &local_1988;
              pVStack_e50 = local_1bc0;
              local_1428._8_8_ = pdVar9;
              local_e78._8_8_ =
                   (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                    *)local_1470;
              sStack_e68.m_other = (double)local_1470;
              local_e60.m_matrix = (non_const_type)local_e78._0_8_;
              Eigen::internal::
              call_dense_assignment_loop<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>const>,0>,Eigen::Matrix<double,3,1,0,3,1>,1>,Eigen::internal::assign_op<double,double>>
                        ((Matrix<double,_3,_1,_0,_3,_1> *)pdVar9,
                         (Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>
                          *)local_e88,(assign_op<double,_double> *)local_1a00);
              local_1400.m_other = dt;
              if (((SrcEvaluatorType *)local_18f8._8_8_ == (SrcEvaluatorType *)0x3) &&
                 ((assign_op<double,_double> *)local_18f8._16_8_ == (assign_op<double,_double> *)0x1
                 )) {
                local_1a00._0_8_ = local_18f8._0_8_;
                local_e88._8_8_ = local_1428;
                local_e78._0_8_ = local_1a48;
                local_e78._8_8_ = local_18f8;
                local_e88._0_8_ = (assign_op<double,_double> *)local_1a00;
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                       *)local_e88);
                puVar8 = local_300 + 0x48;
                lVar7 = 0;
                do {
                  lVar10 = 0;
                  do {
                    uVar19 = 0x3ff0000000000000;
                    if (lVar7 != lVar10) {
                      uVar19 = 0;
                    }
                    *(undefined8 *)(puVar8 + lVar10 * 8) = uVar19;
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 3);
                  lVar7 = lVar7 + 1;
                  puVar8 = puVar8 + 0x78;
                } while (lVar7 != 3);
                sStack_e68.m_other = -0.5;
                local_e60.m_matrix = &local_1a98;
                local_1428._0_8_ = local_300 + 0x180;
                local_1428._8_8_ = (double *)0x3;
                local_1428._16_8_ = (assign_op<double,_double> *)0x3;
                local_1410.m_matrix = (non_const_type)local_738;
                local_1408.m_other = 1.48219693752374e-323;
                local_1400.m_other = 5.92878775009496e-323;
                local_13f8.m_other = 7.4109846876187e-323;
                local_e48.m_other = dt;
                local_e30.m_other = dt;
                Eigen::internal::
                check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                          ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)
                           local_1428,
                           (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                            *)local_e88);
                if (((double *)local_1428._8_8_ == (double *)0x3) &&
                   ((assign_op<double,_double> *)local_1428._16_8_ ==
                    (assign_op<double,_double> *)0x3)) {
                  lVar7 = 0;
                  pdVar9 = (double *)local_1428._0_8_;
                  do {
                    lVar10 = 0;
                    pdVar13 = (double *)local_e60.m_matrix;
                    do {
                      (((DstEvaluatorType *)(pdVar9 + lVar10))->
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      ).m_d.data = (double *)
                                   (*pdVar13 * sStack_e68.m_other * local_e48.m_other *
                                   local_e30.m_other);
                      lVar10 = lVar10 + 1;
                      pdVar13 = pdVar13 + 3;
                    } while (lVar10 != 3);
                    lVar7 = lVar7 + 1;
                    local_e60.m_matrix = (non_const_type)((long)local_e60.m_matrix + 8);
                    pdVar9 = pdVar9 + 0xf;
                  } while (lVar7 != 3);
                  local_1428._8_8_ = &local_1a98;
                  local_e88._0_8_ = local_300 + 0x198;
                  local_e88._8_8_ =
                       (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                        *)0x3;
                  local_e78._0_8_ = (plainobjectbase_evaluator_data<double,_0>)0x3;
                  local_e78._8_8_ = local_738;
                  sStack_e68.m_other = 2.96439387504748e-323;
                  local_e60.m_matrix = (non_const_type)0xc;
                  local_e58.m_other = 7.4109846876187e-323;
                  local_1408.m_other = dt;
                  Eigen::internal::
                  check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,15,0,15,15>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                            ((Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false> *)
                             local_e88,
                             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                              *)local_1428);
                  if (((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                        *)local_e88._8_8_ ==
                       (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                        *)0x3) &&
                     ((assign_op<double,_double> *)local_e78._0_8_ ==
                      (assign_op<double,_double> *)0x3)) {
                    lVar7 = 0;
                    pdVar9 = (double *)local_1428._8_8_;
                    paVar11 = (assign_op<double,_double> *)local_e88._0_8_;
                    do {
                      lVar10 = 0;
                      pdVar13 = pdVar9;
                      do {
                        *(double *)(paVar11 + lVar10 * 8) = -*pdVar13 * local_1408.m_other;
                        lVar10 = lVar10 + 1;
                        pdVar13 = pdVar13 + 3;
                      } while (lVar10 != 3);
                      lVar7 = lVar7 + 1;
                      pdVar9 = pdVar9 + 1;
                      paVar11 = paVar11 + 0x78;
                    } while (lVar7 != 3);
                    puVar8 = local_138;
                    lVar7 = 0;
                    do {
                      lVar10 = 0;
                      do {
                        uVar19 = 0x3ff0000000000000;
                        if (lVar7 != lVar10) {
                          uVar19 = 0;
                        }
                        *(undefined8 *)(puVar8 + lVar10 * 8) = uVar19;
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      lVar7 = lVar7 + 1;
                      puVar8 = puVar8 + 0x78;
                    } while (lVar7 != 3);
                    memset((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                            *)local_1428,0,0x5a0);
                    local_18f8._0_8_ =
                         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                          *)local_1428;
                    local_18f8._8_8_ = (SrcEvaluatorType *)0x3;
                    local_18f8._16_8_ = (assign_op<double,_double> *)0x3;
                    local_18f8._24_8_ =
                         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                          *)local_1428;
                    local_18f8._32_8_ = 0.0;
                    local_18f8._40_8_ = 0;
                    local_18f8._48_8_ = 7.4109846876187e-323;
                    local_e88._8_8_ =
                         (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                          *)local_e78;
                    lVar7 = 0x20;
                    do {
                      dVar32 = *(double *)(local_1a00 + lVar7 + 0x10);
                      dVar33 = *(double *)(local_1a00 + lVar7 + 0x18);
                      dVar17 = *(double *)((long)local_19e0 + lVar7);
                      *(double *)((long)adStack_e98 + lVar7) =
                           dVar17 * -(double)local_1ae8._48_8_ +
                           dVar33 * -(double)local_1ae8._24_8_ + dVar32 * -(double)local_1ae8._0_8_;
                      *(double *)((long)adStack_e98 + lVar7 + 8) =
                           dVar17 * -(double)local_1ae8._56_8_ +
                           dVar33 * -(double)local_1ae8._32_8_ + dVar32 * -(double)local_1ae8._8_8_;
                      *(double *)(local_e88 + lVar7) =
                           (dVar17 * -(double)local_1ae8._64_8_ - dVar33 * (double)local_1ae8._40_8_
                           ) - dVar32 * (double)local_1ae8._16_8_;
                      lVar7 = lVar7 + 0x18;
                    } while (lVar7 != 0x68);
                    local_1a00._0_8_ = local_1a48;
                    local_1a00._24_8_ = local_18f8;
                    local_1a48._0_8_ =
                         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                          *)local_1428;
                    local_1a00._8_8_ = (RhsNested)local_e88;
                    local_1a00._16_8_ = (assign_op<double,_double> *)&local_1a08;
                    local_e30.m_other = dt;
                    Eigen::internal::
                    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                           *)local_1a00);
                    sStack_e68.m_other = -0.5;
                    local_e60.m_matrix = &local_1a98;
                    local_18f8._8_8_ = 3;
                    local_18f8._0_8_ = local_12a8;
                    local_18f8._16_8_ = (assign_op<double,_double> *)0x3;
                    local_18f8._32_8_ = 1.48219693752374e-323;
                    local_18f8._40_8_ = 3;
                    local_18f8._48_8_ = 7.4109846876187e-323;
                    local_18f8._24_8_ =
                         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                          *)local_1428;
                    local_e48.m_other = dt;
                    local_e30.m_other = dt;
                    Eigen::internal::
                    check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,12,0,15,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                              ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)
                               local_18f8,
                               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                                *)local_e88);
                    if (((SrcEvaluatorType *)local_18f8._8_8_ == (SrcEvaluatorType *)0x3) &&
                       ((assign_op<double,_double> *)local_18f8._16_8_ ==
                        (assign_op<double,_double> *)0x3)) {
                      lVar7 = 0;
                      pDVar12 = (DstEvaluatorType *)local_18f8._0_8_;
                      do {
                        lVar10 = 0;
                        pdVar9 = (double *)local_e60.m_matrix;
                        do {
                          (&(pDVar12->
                            super_block_evaluator<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false,_true>
                            ).
                            super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_15,_15>_>
                            .m_data)[lVar10] =
                               (PointerType)
                               (*pdVar9 * sStack_e68.m_other * local_e48.m_other * local_e30.m_other
                               );
                          lVar10 = lVar10 + 1;
                          pdVar9 = pdVar9 + 3;
                        } while (lVar10 != 3);
                        lVar7 = lVar7 + 1;
                        local_e60.m_matrix = (non_const_type)((long)local_e60.m_matrix + 8);
                        pDVar12 = (DstEvaluatorType *)
                                  &pDVar12[7].
                                   super_block_evaluator<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false,_true>
                                   .
                                   super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_0,_15,_15>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_15,_15>_>
                                   .field_0x8;
                      } while (lVar7 != 3);
                      src = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                             *)local_18f8;
                      local_18f8._8_8_ = &local_1a98;
                      local_e88._0_8_ = local_1290;
                      local_e88._8_8_ =
                           (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                            *)0x3;
                      local_e78._0_8_ = (assign_op<double,_double> *)0x3;
                      sStack_e68.m_other = 2.96439387504748e-323;
                      local_e60.m_matrix = (non_const_type)0x3;
                      local_e58.m_other = 7.4109846876187e-323;
                      local_18f8._32_8_ = dt;
                      local_e78._8_8_ =
                           (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                            *)local_1428;
                      Eigen::internal::
                      check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,12,0,15,12>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>>
                                ((Block<Eigen::Matrix<double,_15,_12,_0,_15,_12>,__1,__1,_false> *)
                                 local_e88,src);
                      if (((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                            *)local_e88._8_8_ ==
                           (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>,_0>
                            *)0x3) && ((double *)local_e78._0_8_ == (double *)0x3)) {
                        lVar7 = 0;
                        pdVar9 = (double *)local_18f8._8_8_;
                        paVar11 = (assign_op<double,_double> *)local_e88._0_8_;
                        do {
                          lVar10 = 0;
                          pdVar13 = pdVar9;
                          do {
                            *(double *)(paVar11 + lVar10 * 8) =
                                 -*pdVar13 * (double)local_18f8._32_8_;
                            lVar10 = lVar10 + 1;
                            pdVar13 = pdVar13 + 3;
                          } while (lVar10 != 3);
                          lVar7 = lVar7 + 1;
                          pdVar9 = pdVar9 + 1;
                          paVar11 = paVar11 + 0x78;
                        } while (lVar7 != 3);
                        puVar8 = local_1110;
                        lVar7 = 0;
                        do {
                          lVar10 = 0;
                          do {
                            uVar19 = 0x3ff0000000000000;
                            if (lVar7 != lVar10) {
                              uVar19 = 0;
                            }
                            *(undefined8 *)(puVar8 + lVar10 * 8) = uVar19;
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 3);
                          lVar7 = lVar7 + 1;
                          puVar8 = puVar8 + 0x78;
                        } while (lVar7 != 3);
                        puVar8 = local_f90;
                        lVar7 = 0;
                        do {
                          lVar10 = 0;
                          do {
                            uVar19 = 0x3ff0000000000000;
                            if (lVar7 != lVar10) {
                              uVar19 = 0;
                            }
                            *(undefined8 *)(puVar8 + lVar10 * 8) = uVar19;
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 3);
                          lVar7 = lVar7 + 1;
                          puVar8 = puVar8 + 0x78;
                        } while (lVar7 != 3);
                        lVar7 = 0;
                        memset(src,0,0x480);
                        dVar32 = this->gyro_noise;
                        do {
                          lVar10 = 0;
                          do {
                            dVar33 = 1.0;
                            if (lVar7 != lVar10) {
                              dVar33 = 0.0;
                            }
                            *(double *)(&src->field_0x0 + lVar10 * 8) =
                                 (dVar33 * dVar32 * dVar32) / dt;
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 3);
                          lVar7 = lVar7 + 1;
                          src = src + 2;
                        } while (lVar7 != 3);
                        dVar32 = this->accel_noise;
                        puVar8 = local_18f8 + 0x138;
                        lVar7 = 0;
                        do {
                          lVar10 = 0;
                          do {
                            dVar33 = 1.0;
                            if (lVar7 != lVar10) {
                              dVar33 = 0.0;
                            }
                            *(double *)(puVar8 + lVar10 * 8) = (dVar33 * dVar32 * dVar32) / dt;
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 3);
                          lVar7 = lVar7 + 1;
                          puVar8 = puVar8 + 0x60;
                        } while (lVar7 != 3);
                        dVar32 = this->gyro_rw;
                        puVar8 = local_18f8 + 0x270;
                        lVar7 = 0;
                        do {
                          lVar10 = 0;
                          do {
                            dVar33 = 1.0;
                            if (lVar7 != lVar10) {
                              dVar33 = 0.0;
                            }
                            *(double *)(puVar8 + lVar10 * 8) = dVar33 * dVar32 * dVar32 * dt;
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 3);
                          lVar7 = lVar7 + 1;
                          puVar8 = puVar8 + 0x60;
                        } while (lVar7 != 3);
                        dVar32 = this->accel_rw;
                        puVar8 = local_18f8 + 0x3a8;
                        lVar7 = 0;
                        do {
                          lVar10 = 0;
                          do {
                            dVar33 = 1.0;
                            if (lVar7 != lVar10) {
                              dVar33 = 0.0;
                            }
                            *(double *)(puVar8 + lVar10 * 8) = dVar33 * dVar32 * dVar32 * dt;
                            lVar10 = lVar10 + 1;
                          } while (lVar10 != 3);
                          lVar7 = lVar7 + 1;
                          puVar8 = puVar8 + 0x60;
                        } while (lVar7 != 3);
                        local_1a00._8_8_ = local_18f8;
                        local_1a00._0_8_ =
                             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                              *)local_1428;
                        local_1a00._16_8_ =
                             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                              *)local_1428;
                        memset((Matrix<double,_15,_15,_0,_15,_15> *)local_e88,0,0x708);
                        local_1a48._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
                        Eigen::internal::
                        generic_product_impl<Eigen::Product<Eigen::Matrix<double,15,12,0,15,12>,Eigen::Matrix<double,12,12,0,12,12>,0>,Eigen::Transpose<Eigen::Matrix<double,15,12,0,15,12>>,Eigen::DenseShape,Eigen::DenseShape,8>
                        ::scaleAndAddTo<Eigen::Matrix<double,15,15,0,15,15>>
                                  ((Matrix<double,_15,_15,_0,_15,_15> *)local_e88,
                                   (Product<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_Eigen::Matrix<double,_12,_12,_0,_12,_12>,_0>
                                    *)local_1a00,
                                   (Transpose<Eigen::Matrix<double,_15,_12,_0,_15,_12>_> *)
                                   (local_1a00 + 0x10),(Scalar *)local_1a48);
                        local_1a00._8_8_ = (RhsNested)0x3fe0000000000000;
                        local_1a48._16_8_ = &local_1bc1;
                        local_1a48._0_8_ = (assign_op<double,_double> *)&local_1a08;
                        local_1a48._8_8_ =
                             (Product<Eigen::Matrix<double,_15,_12,_0,_15,_12>,_Eigen::Matrix<double,_12,_12,_0,_12,_12>,_0>
                              *)local_1a00;
                        local_1a48._24_8_ = (Matrix<double,_15,_15,_0,_15,_15> *)local_e88;
                        local_1a08 = (Matrix<double,_15,_15,_0,_15,_15> *)local_e88;
                        local_19e0[0] = (Matrix<double,_15,_15,_0,_15,_15> *)local_e88;
                        local_19e0[1] = (Matrix<double,_15,_15,_0,_15,_15> *)local_e88;
                        Eigen::internal::
                        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
                        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_const_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                               *)local_1a48);
                        dst = &this->P_;
                        local_1a00._0_8_ = local_738;
                        local_1a00._8_8_ = dst;
                        local_1a00._16_8_ = local_1a00._0_8_;
                        local_1a00._24_8_ = (Matrix<double,_15,_15,_0,_15,_15> *)local_e88;
                        Eigen::internal::
                        call_dense_assignment_loop<Eigen::Matrix<double,15,15,0,15,15>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,15,15,0,15,15>,Eigen::Matrix<double,15,15,0,15,15>,0>,Eigen::Transpose<Eigen::Matrix<double,15,15,0,15,15>>,0>const,Eigen::Matrix<double,15,15,0,15,15>const>,Eigen::internal::assign_op<double,double>>
                                  (dst,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_15,_15,_0,_15,_15>,_Eigen::Matrix<double,_15,_15,_0,_15,_15>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>,_0>,_const_Eigen::Matrix<double,_15,_15,_0,_15,_15>_>
                                        *)local_1a00,(assign_op<double,_double> *)local_1a48);
                        lVar7 = 0x80;
                        do {
                          if ((dst->super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>
                              ).m_storage.m_data.array[0] <= 0.0 &&
                              (dst->super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>
                              ).m_storage.m_data.array[0] != 0.0) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"WARNING: P is not PSD!\n",0x17);
                          }
                          dst = (Matrix<double,_15,_15,_0,_15,_15> *)
                                ((dst->
                                 super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>).
                                 m_storage.m_data.array + 0x10);
                          lVar7 = lVar7 + 0x78;
                        } while (lVar7 != 0x788);
                        return;
                      }
                    }
                    __function = 
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 15, 12>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 15, 12>>]"
                    ;
                    goto LAB_00105bc6;
                  }
                }
              }
            }
          }
        }
      }
    }
    __function = 
    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 15, 15>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 15, 15>>]"
    ;
  }
  else {
    __function = 
    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 4, 4>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 4, 4>>]"
    ;
  }
LAB_00105bc6:
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,__function);
}

Assistant:

void InsEkf::Predict(double dt) { // https://docs.openvins.com/propagation.html

        Eigen::Vector3d w_est = last_measurements_.segment(m_I(MI::p), 3) - bias_g_;
        Eigen::Vector3d a_est = last_measurements_.segment(m_I(MI::ax), 3) - bias_a_;

        // subtract the effect of rotating at offset from vehicle center
        a_est -= SkewSymmetric(w_est) * SkewSymmetric(w_est) * imu_offset_;

        Eigen::Matrix3d w_ss = SkewSymmetric(w_est);
        Eigen::Matrix4d omega = Eigen::Matrix4d::Zero();
        omega.block(0, 0, 3, 3) = -w_ss;
        omega.block(0, 3, 3, 1) = w_est;
        omega.block(3, 0, 1, 3) = -w_est.transpose();

        double angle_rate = w_est.norm();

        // Trawny et al, equation 103, p.12
        Eigen::Matrix4d theta = Eigen::Matrix4d::Identity() + 0.5 * dt * omega;
        if(angle_rate > 1e-10)
            theta = cos(0.5 * angle_rate * dt) * Eigen::Matrix4d::Identity() + (1.0 / angle_rate) * sin(0.5 * angle_rate * dt) * omega;

        // propagate orientation
        orientation_ = theta * orientation_;

        // propagate velocity and position
        Eigen::Matrix3d R_ItoB_hat = RPYToRotMat(QuatToRPY(orientation_)); // rotation matrix estimate from inertial to body frame
        velocity_ = velocity_ - dt * gravity_ + R_ItoB_hat.transpose() * a_est * dt;
        position_ = position_ + dt * velocity_ - 0.5 * gravity_ * dt * dt + 0.5 * R_ItoB_hat.transpose() * a_est * dt * dt;

        // propagate covariance
        double angle = angle_rate * dt;

        // exponential map
        Eigen::Matrix3d R_pert = Eigen::Matrix3d::Identity();
        // SO3 right jacobian
        Eigen::Matrix3d Jr = Eigen::Matrix3d::Identity();

        if(angle > 1e-10){
            Eigen::Vector3d rate_vect = w_est / angle_rate; // normalize

            // Barfoot, equation 6.56, p. 189
            R_pert = cos(angle) * Eigen::Matrix3d::Identity() + (1.0 - cos(angle)) * (rate_vect * rate_vect.transpose()) +
                                     sin(angle) * SkewSymmetric(rate_vect);

            // Barfoot, equation 7.77a, p. 233
            Jr = (sin(angle) / angle) * Eigen::Matrix3d::Identity() + (1.0 - sin(angle) / angle) * (rate_vect * rate_vect.transpose()) -
                 ((1.0 - cos(angle))/angle) * SkewSymmetric(rate_vect);
        }

        Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)> Phi_k = Eigen::Matrix<double, s_I(SI::NUM_STATES), s_I(SI::NUM_STATES)>::Zero();
        Phi_k.block(s_I(SI::roll), s_I(SI::roll), 3, 3) = R_pert;
        Phi_k.block(s_I(SI::x), s_I(SI::roll), 3, 3) = -0.5 * R_ItoB_hat.transpose() * SkewSymmetric(a_est * dt * dt);
        Phi_k.block(s_I(SI::Vx), s_I(SI::roll), 3, 3) = -R_ItoB_hat.transpose() * SkewSymmetric(a_est * dt);

        Phi_k.block(s_I(SI::x), s_I(SI::x), 3, 3).setIdentity();

        Phi_k.block(s_I(SI::x), s_I(SI::Vx), 3, 3) = dt * Eigen::Matrix3d::Identity();
        Phi_k.block(s_I(SI::Vx), s_I(SI::Vx), 3, 3).setIdentity();

        Phi_k.block(s_I(SI::roll), s_I(SI::biasGp), 3, 3) = -R_pert * Jr * dt;
        Eigen::Matrix3d d_w_skew_d_biasGp = SkewSymmetric(Eigen::Vector3d{-1.0, 0.0, 0.0});
        Phi_k.block(s_I(SI::x), s_I(SI::biasGp), 3, 1) = -0.5 * R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGp + d_w_skew_d_biasGp*w_ss) * imu_offset_ * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasGp), 3, 1) = -R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGp + d_w_skew_d_biasGp*w_ss) * imu_offset_ * dt;
        Eigen::Matrix3d d_w_skew_d_biasGq = SkewSymmetric(Eigen::Vector3d{0.0, -1.0, 0.0});
        Phi_k.block(s_I(SI::x), s_I(SI::biasGq), 3, 1) = -0.5 * R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGq + d_w_skew_d_biasGq*w_ss) * imu_offset_ * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasGq), 3, 1) = -R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGq + d_w_skew_d_biasGq*w_ss) * imu_offset_ * dt;
        Eigen::Matrix3d d_w_skew_d_biasGr = SkewSymmetric(Eigen::Vector3d{0.0, 0.0, -1.0});
        Phi_k.block(s_I(SI::x), s_I(SI::biasGr), 3, 1) = -0.5 * R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGr + d_w_skew_d_biasGr*w_ss) * imu_offset_ * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasGr), 3, 1) = -R_ItoB_hat.transpose() * (w_ss*d_w_skew_d_biasGr + d_w_skew_d_biasGr*w_ss) * imu_offset_ * dt;
        Phi_k.block(s_I(SI::biasGp), s_I(SI::biasGp), 3, 3).setIdentity();

        Phi_k.block(s_I(SI::x), s_I(SI::biasAx), 3, 3) = -0.5 * R_ItoB_hat.transpose() * dt * dt;
        Phi_k.block(s_I(SI::Vx), s_I(SI::biasAx), 3, 3) = -R_ItoB_hat.transpose() * dt;
        Phi_k.block(s_I(SI::biasAx), s_I(SI::biasAx), 3, 3).setIdentity();


        Eigen::Matrix<double, s_I(SI::NUM_STATES), 12> Gk = Eigen::Matrix<double, s_I(SI::NUM_STATES), 12>::Zero();
        Gk.block(s_I(SI::roll), m_I(MI::p), 3, 3) = -R_pert * Jr * dt;
        Gk.block(s_I(SI::x), m_I(MI::ax), 3, 3) = -0.5 * R_ItoB_hat.transpose() * dt * dt;
        Gk.block(s_I(SI::Vx), m_I(MI::ax), 3 ,3) = -R_ItoB_hat.transpose() * dt;
        Gk.block(s_I(SI::biasGp), m_I(MI::p) + 6, 3, 3).setIdentity();
        Gk.block(s_I(SI::biasAx), m_I(MI::ax) + 6, 3, 3).setIdentity();

        Eigen::Matrix<double, 12, 12> Qd = Eigen::Matrix<double, 12, 12>::Zero();
        Qd.block(m_I(MI::p), m_I(MI::p), 3, 3) = pow(gyro_noise, 2) * Eigen::Matrix3d::Identity() / dt;
        Qd.block(m_I(MI::ax), m_I(MI::ax), 3, 3) = pow(accel_noise, 2) * Eigen::Matrix3d::Identity() / dt;
        Qd.block(m_I(MI::p) + 6, m_I(MI::p) + 6, 3, 3) = pow(gyro_rw, 2) * Eigen::Matrix3d::Identity() * dt;
        Qd.block(m_I(MI::ax) + 6, m_I(MI::ax) + 6, 3, 3) = pow(accel_rw, 2) * Eigen::Matrix3d::Identity() * dt;

        Eigen::Matrix<double, 15, 15> GQG = Gk * Qd * Gk.transpose();
        GQG = 0.5 * (GQG + GQG.transpose());

        P_ = Phi_k * P_ * Phi_k.transpose() + GQG;

        for(auto i = 0; i < P_.cols(); ++i){
            if(P_(i, i) < 0.0)
                std::cout<<"WARNING: P is not PSD!\n";
        }
    }